

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  uint uVar9;
  undefined4 uVar10;
  BBox3fa *pBVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  BufferView<embree::Vec3fa> *pBVar17;
  bool bVar18;
  long lVar19;
  long lVar20;
  size_t sVar21;
  uint uVar22;
  int iVar23;
  float fVar24;
  float fVar25;
  vfloat4 a;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  float fVar72;
  float fVar78;
  Vec3ff v3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar79;
  float fVar86;
  float fVar88;
  vfloat4 a0;
  float fVar87;
  float fVar89;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar104;
  float fVar109;
  float fVar110;
  undefined1 auVar105 [16];
  float fVar111;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar108;
  float fVar112;
  float fVar120;
  float fVar122;
  Vec3fa n1;
  undefined1 auVar115 [16];
  float fVar113;
  float fVar114;
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar119;
  float fVar125;
  vfloat4 a_1;
  float fVar130;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar136;
  float fVar137;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  uint uVar143;
  float fVar144;
  float fVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar149 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar150 [16];
  undefined1 auVar156 [16];
  uint uVar157;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  Vec3fa n0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BBox1f local_2e8;
  undefined1 local_2c8 [16];
  anon_class_16_2_07cfa4d6 local_288;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  size_t local_240;
  float local_234;
  size_t local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  PrimRef *local_120;
  PrimInfo *local_118;
  ulong local_110;
  BufferView<embree::Vec3fa> *local_108;
  ulong local_100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  local_1f8._8_8_ = 0x7f8000007f800000;
  local_1f8._0_8_ = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  local_208._8_8_ = 0xff800000ff800000;
  local_208._0_8_ = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.lower;
  fVar3 = time_range->lower;
  if (time_range->lower <= fVar2) {
    fVar3 = fVar2;
  }
  fVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          super_Geometry.time_range.upper;
  if (time_range->upper <= fVar2) {
    fVar2 = time_range->upper;
  }
  if (fVar3 <= fVar2) {
    uVar14 = r->_begin;
    local_118 = __return_storage_ptr__;
    if (uVar14 < r->_end) {
      local_240 = 0;
      local_228._8_8_ = 0x7f8000007f800000;
      local_228._0_8_ = 0x7f8000007f800000;
      local_218._8_8_ = 0xff800000ff800000;
      local_218._0_8_ = 0xff800000ff800000;
      local_1f8._8_8_ = 0x7f8000007f800000;
      local_1f8._0_8_ = 0x7f8000007f800000;
      local_208._8_8_ = 0xff800000ff800000;
      local_208._0_8_ = 0xff800000ff800000;
      local_230 = k;
      local_120 = prims;
      do {
        local_2e8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                    super_CurveGeometry.super_Geometry.time_range;
        fVar25 = local_2e8.lower;
        fVar125 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .super_Geometry.fnumTimeSegments;
        fVar40 = local_2e8.upper - fVar25;
        fVar24 = floorf(((fVar3 - fVar25) / fVar40) * 1.0000002 * fVar125);
        fVar40 = ceilf(((fVar2 - fVar25) / fVar40) * 0.99999976 * fVar125);
        uVar22 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar14);
        uVar12 = (ulong)(uVar22 + 3);
        pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if (uVar12 < (pBVar4->super_RawBufferView).num) {
          fVar25 = 0.0;
          if (0.0 <= fVar24) {
            fVar25 = fVar24;
          }
          if (fVar125 <= fVar40) {
            fVar40 = fVar125;
          }
          if ((uint)(int)fVar25 <= (uint)(int)fVar40) {
            uVar15 = (ulong)(int)fVar25;
            local_110 = (ulong)(int)fVar40;
            local_108 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                        super_CurveGeometry.normals.items;
            local_234 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                        super_CurveGeometry.maxRadiusScale;
            pBVar17 = local_108;
            do {
              pcVar5 = pBVar4[uVar15].super_RawBufferView.ptr_ofs;
              sVar21 = pBVar4[uVar15].super_RawBufferView.stride;
              lVar19 = sVar21 * uVar22;
              lVar20 = sVar21 * (uVar22 + 1);
              lVar13 = sVar21 * (uVar22 + 2);
              lVar16 = sVar21 * uVar12;
              fVar40 = (float)DAT_01f7f930;
              fVar24 = DAT_01f7f930._4_4_;
              fVar25 = DAT_01f7f930._8_4_;
              fVar41 = DAT_01f7f930._12_4_;
              auVar107._4_4_ = -(uint)(fVar24 <= ABS(*(float *)(pcVar5 + lVar20 + 0xc)));
              auVar107._0_4_ = -(uint)(fVar40 <= ABS(*(float *)(pcVar5 + lVar19 + 0xc)));
              auVar107._8_4_ = -(uint)(fVar25 <= ABS(*(float *)(pcVar5 + lVar13 + 0xc)));
              auVar107._12_4_ = -(uint)(fVar41 <= ABS(*(float *)(pcVar5 + lVar16 + 0xc)));
              iVar23 = movmskps((int)pBVar17,auVar107);
              if (iVar23 != 0) goto LAB_009db6a7;
              pfVar1 = (float *)(pcVar5 + lVar19);
              fVar71 = *pfVar1;
              fVar94 = pfVar1[1];
              fVar86 = pfVar1[2];
              fVar90 = pfVar1[3];
              auVar118._0_4_ = -(uint)(fVar71 < fVar40 && -1.844e+18 < fVar71);
              auVar118._4_4_ = -(uint)(fVar94 < fVar24 && -1.844e+18 < fVar94);
              auVar118._8_4_ = -(uint)(fVar86 < fVar25 && -1.844e+18 < fVar86);
              auVar118._12_4_ = -(uint)(fVar90 < fVar41 && -1.844e+18 < fVar90);
              uVar10 = movmskps(0,auVar118);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              pfVar1 = (float *)(pcVar5 + lVar20);
              fVar72 = *pfVar1;
              fVar99 = pfVar1[1];
              fVar78 = pfVar1[2];
              fVar91 = pfVar1[3];
              auVar56._0_4_ = -(uint)(fVar72 < fVar40 && -1.844e+18 < fVar72);
              auVar56._4_4_ = -(uint)(fVar99 < fVar24 && -1.844e+18 < fVar99);
              auVar56._8_4_ = -(uint)(fVar78 < fVar25 && -1.844e+18 < fVar78);
              auVar56._12_4_ = -(uint)(fVar91 < fVar41 && -1.844e+18 < fVar91);
              uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar56);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              pfVar1 = (float *)(pcVar5 + lVar13);
              fVar102 = *pfVar1;
              fVar95 = pfVar1[1];
              fVar96 = pfVar1[2];
              fVar92 = pfVar1[3];
              auVar149._0_4_ = -(uint)(fVar102 < fVar40 && -1.844e+18 < fVar102);
              auVar149._4_4_ = -(uint)(fVar95 < fVar24 && -1.844e+18 < fVar95);
              auVar149._8_4_ = -(uint)(fVar96 < fVar25 && -1.844e+18 < fVar96);
              auVar149._12_4_ = -(uint)(fVar92 < fVar41 && -1.844e+18 < fVar92);
              uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar149);
              pBVar17 = (BufferView<embree::Vec3fa> *)
                        (ulong)CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              pfVar1 = (float *)(pcVar5 + lVar16);
              fVar100 = *pfVar1;
              fVar101 = pfVar1[1];
              fVar103 = pfVar1[2];
              fVar93 = pfVar1[3];
              auVar150._0_4_ = -(uint)(fVar100 < fVar40 && -1.844e+18 < fVar100);
              auVar150._4_4_ = -(uint)(fVar101 < fVar24 && -1.844e+18 < fVar101);
              auVar150._8_4_ = -(uint)(fVar103 < fVar25 && -1.844e+18 < fVar103);
              auVar150._12_4_ = -(uint)(fVar93 < fVar41 && -1.844e+18 < fVar93);
              uVar10 = movmskps((int)lVar16,auVar150);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              pcVar5 = local_108[uVar15].super_RawBufferView.ptr_ofs;
              sVar21 = local_108[uVar15].super_RawBufferView.stride;
              lVar13 = sVar21 * uVar22;
              pfVar1 = (float *)(pcVar5 + lVar13);
              fVar132 = *pfVar1;
              fVar139 = pfVar1[1];
              fVar142 = pfVar1[2];
              auVar156._0_4_ = -(uint)(fVar132 < fVar40 && -1.844e+18 < fVar132);
              auVar156._4_4_ = -(uint)(fVar139 < fVar24 && -1.844e+18 < fVar139);
              auVar156._8_4_ = -(uint)(fVar142 < fVar25 && -1.844e+18 < fVar142);
              auVar156._12_4_ = -(uint)(pfVar1[3] < fVar41 && -1.844e+18 < pfVar1[3]);
              uVar10 = movmskps((int)lVar13,auVar156);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              lVar13 = sVar21 * (uVar22 + 1);
              auVar107 = *(undefined1 (*) [16])(pcVar5 + lVar13);
              fVar112 = auVar107._0_4_;
              fVar120 = auVar107._4_4_;
              fVar114 = auVar107._8_4_;
              auVar97._0_4_ = -(uint)(fVar112 < fVar40 && -1.844e+18 < fVar112);
              auVar97._4_4_ = -(uint)(fVar120 < fVar24 && -1.844e+18 < fVar120);
              auVar97._8_4_ = -(uint)(fVar114 < fVar25 && -1.844e+18 < fVar114);
              auVar97._12_4_ = -(uint)(auVar107._12_4_ < fVar41 && -1.844e+18 < auVar107._12_4_);
              uVar10 = movmskps((int)lVar13,auVar97);
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              fVar90 = fVar90 * local_234;
              fVar91 = fVar91 * local_234;
              fVar92 = fVar92 * local_234;
              fVar93 = fVar93 * local_234;
              lVar16 = sVar21 * (uVar22 + 2);
              pfVar1 = (float *)(pcVar5 + lVar16);
              fVar123 = *pfVar1;
              fVar133 = pfVar1[1];
              fVar145 = pfVar1[2];
              pfVar1 = (float *)(pcVar5 + sVar21 * uVar12);
              fVar148 = *pfVar1;
              fVar153 = pfVar1[1];
              fVar130 = pfVar1[2];
              fVar104 = (fVar102 * 0.5 + fVar100 * 0.0 + fVar72 * 0.0) - fVar71 * 0.5;
              fVar109 = (fVar95 * 0.5 + fVar101 * 0.0 + fVar99 * 0.0) - fVar94 * 0.5;
              fVar110 = (fVar96 * 0.5 + fVar103 * 0.0 + fVar78 * 0.0) - fVar86 * 0.5;
              fVar111 = (fVar92 * 0.5 + fVar93 * 0.0 + fVar91 * 0.0) - fVar90 * 0.5;
              fVar131 = (fVar123 * 0.5 + fVar148 * 0.0 + fVar112 * 0.0) - fVar132 * 0.5;
              fVar136 = (fVar133 * 0.5 + fVar153 * 0.0 + fVar120 * 0.0) - fVar139 * 0.5;
              fVar137 = (fVar145 * 0.5 + fVar130 * 0.0 + fVar114 * 0.0) - fVar142 * 0.5;
              fStack_134 = fVar102 * 0.0 + fVar100 * -0.0 + fVar72 + fVar71 * -0.0;
              local_268._4_4_ = fVar95 * 0.0 + fVar101 * -0.0 + fVar99 + fVar94 * -0.0;
              fVar151 = fVar96 * 0.0 + fVar103 * -0.0 + fVar78 + fVar86 * -0.0;
              fVar154 = fVar92 * 0.0 + fVar93 * -0.0 + fVar91 + fVar90 * -0.0;
              fVar138 = fVar123 * 0.0 + fVar148 * -0.0 + fVar112 + fVar132 * -0.0;
              fVar141 = fVar133 * 0.0 + fVar153 * -0.0 + fVar120 + fVar139 * -0.0;
              fVar144 = fVar145 * 0.0 + fVar130 * -0.0 + fVar114 + fVar142 * -0.0;
              local_168 = fVar100 * -0.0 + fVar102 + fVar72 * 0.0 + fVar71 * -0.0;
              local_178 = fVar101 * -0.0 + fVar95 + fVar99 * 0.0 + fVar94 * -0.0;
              fVar152 = fVar103 * -0.0 + fVar96 + fVar78 * 0.0 + fVar86 * -0.0;
              fVar155 = fVar93 * -0.0 + fVar92 + fVar91 * 0.0 + fVar90 * -0.0;
              fVar113 = fVar71 * 0.0 + ((fVar100 * 0.5 + fVar102 * 0.0) - fVar72 * 0.5);
              fVar121 = fVar94 * 0.0 + ((fVar101 * 0.5 + fVar95 * 0.0) - fVar99 * 0.5);
              fVar122 = fVar86 * 0.0 + ((fVar103 * 0.5 + fVar96 * 0.0) - fVar78 * 0.5);
              fVar124 = fVar90 * 0.0 + ((fVar93 * 0.5 + fVar92 * 0.0) - fVar91 * 0.5);
              fVar94 = fVar148 * -0.0 + fVar123 + fVar112 * 0.0 + fVar132 * -0.0;
              fVar99 = fVar153 * -0.0 + fVar133 + fVar120 * 0.0 + fVar139 * -0.0;
              fVar102 = fVar130 * -0.0 + fVar145 + fVar114 * 0.0 + fVar142 * -0.0;
              fVar71 = fVar132 * 0.0 + ((fVar148 * 0.5 + fVar123 * 0.0) - fVar112 * 0.5);
              fVar86 = fVar139 * 0.0 + ((fVar153 * 0.5 + fVar133 * 0.0) - fVar120 * 0.5);
              fVar90 = fVar142 * 0.0 + ((fVar130 * 0.5 + fVar145 * 0.0) - fVar114 * 0.5);
              fVar139 = fVar138 * fVar109 - fVar141 * fVar104;
              fVar142 = fVar141 * fVar110 - fVar144 * fVar109;
              fVar145 = fVar144 * fVar104 - fVar138 * fVar110;
              fVar72 = fVar109 * fVar131 - fVar136 * fVar104;
              fVar78 = fVar110 * fVar136 - fVar137 * fVar109;
              fVar91 = fVar104 * fVar137 - fVar131 * fVar110;
              fVar95 = fVar94 * fVar121 - fVar99 * fVar113;
              fVar100 = fVar99 * fVar122 - fVar102 * fVar121;
              fVar103 = fVar102 * fVar113 - fVar94 * fVar122;
              fVar94 = fVar121 * fVar71 - fVar86 * fVar113;
              fVar86 = fVar122 * fVar86 - fVar90 * fVar121;
              fVar90 = fVar113 * fVar90 - fVar71 * fVar122;
              fVar102 = fVar145 * fVar145 + fVar142 * fVar142 + fVar139 * fVar139;
              auVar118 = ZEXT416((uint)fVar102);
              auVar107 = rsqrtss(ZEXT416((uint)fVar102),auVar118);
              fVar71 = auVar107._0_4_;
              fVar132 = fVar71 * 1.5 - fVar71 * fVar71 * fVar102 * 0.5 * fVar71;
              fVar148 = fVar139 * fVar72 + fVar145 * fVar91 + fVar142 * fVar78;
              auVar107 = rcpss(auVar118,auVar118);
              fVar99 = (2.0 - fVar102 * auVar107._0_4_) * auVar107._0_4_;
              fVar114 = fVar103 * fVar103 + fVar100 * fVar100 + fVar95 * fVar95;
              auVar107 = ZEXT416((uint)fVar114);
              auVar118 = rsqrtss(ZEXT416((uint)fVar114),auVar107);
              fVar71 = auVar118._0_4_;
              fVar96 = fVar71 * 1.5 - fVar71 * fVar71 * fVar114 * 0.5 * fVar71;
              fVar133 = fVar95 * fVar94 + fVar103 * fVar90 + fVar100 * fVar86;
              auVar107 = rcpss(auVar107,auVar107);
              fVar71 = (2.0 - fVar114 * auVar107._0_4_) * auVar107._0_4_;
              fVar92 = fVar154 * fVar142 * fVar132;
              fVar101 = fVar154 * fVar145 * fVar132;
              fVar93 = fVar154 * fVar139 * fVar132;
              fVar112 = fStack_134 - fVar92;
              fVar120 = (float)local_268._4_4_ - fVar101;
              fVar123 = fVar151 - fVar93;
              fVar78 = fVar154 * fVar99 * (fVar102 * fVar78 - fVar148 * fVar142) * fVar132 +
                       fVar111 * fVar142 * fVar132;
              fVar91 = fVar154 * fVar99 * (fVar102 * fVar91 - fVar148 * fVar145) * fVar132 +
                       fVar111 * fVar145 * fVar132;
              fVar102 = fVar154 * fVar99 * (fVar102 * fVar72 - fVar148 * fVar139) * fVar132 +
                        fVar111 * fVar139 * fVar132;
              fVar132 = fVar155 * fVar100 * fVar96;
              fVar139 = fVar155 * fVar103 * fVar96;
              fVar142 = fVar155 * fVar95 * fVar96;
              fVar145 = local_168 - fVar132;
              fVar148 = local_178 - fVar139;
              fVar153 = fVar152 - fVar142;
              fVar72 = fVar155 * fVar71 * (fVar114 * fVar86 - fVar133 * fVar100) * fVar96 +
                       fVar124 * fVar100 * fVar96;
              fVar90 = fVar155 * fVar71 * (fVar114 * fVar90 - fVar133 * fVar103) * fVar96 +
                       fVar124 * fVar103 * fVar96;
              fVar99 = fVar155 * fVar71 * (fVar114 * fVar94 - fVar133 * fVar95) * fVar96 +
                       fVar124 * fVar95 * fVar96;
              fVar95 = (fVar104 - fVar78) * 0.33333334 + fVar112;
              fVar96 = (fVar109 - fVar91) * 0.33333334 + fVar120;
              fVar100 = (fVar110 - fVar102) * 0.33333334 + fVar123;
              fVar71 = fVar145 - (fVar113 - fVar72) * 0.33333334;
              fVar94 = fVar148 - (fVar121 - fVar90) * 0.33333334;
              fVar86 = fVar153 - (fVar122 - fVar99) * 0.33333334;
              lVar13 = 0;
              auVar107 = _DAT_01f7a9f0;
              auVar118 = _DAT_01f7a9f0;
              auVar56 = _DAT_01f7aa00;
              auVar149 = _DAT_01f7aa00;
              auVar150 = _DAT_01f7aa00;
              auVar156 = _DAT_01f7a9f0;
              bVar8 = true;
              do {
                bVar18 = bVar8;
                iVar23 = (int)lVar13;
                lVar19 = lVar13 * 4;
                fVar103 = *(float *)(bezier_basis0 + lVar19 + 0x1dc);
                fVar114 = *(float *)(bezier_basis0 + lVar19 + 0x1e0);
                fVar133 = *(float *)(bezier_basis0 + lVar19 + 0x1e4);
                fVar130 = *(float *)(bezier_basis0 + lVar19 + 0x1e8);
                lVar19 = lVar13 * 4;
                fVar111 = *(float *)(bezier_basis0 + lVar19 + 0x660);
                fVar124 = *(float *)(bezier_basis0 + lVar19 + 0x664);
                fVar131 = *(float *)(bezier_basis0 + lVar19 + 0x668);
                fVar136 = *(float *)(bezier_basis0 + lVar19 + 0x66c);
                lVar19 = lVar13 * 4;
                fVar137 = *(float *)(bezier_basis0 + lVar19 + 0xae4);
                fVar138 = *(float *)(bezier_basis0 + lVar19 + 0xae8);
                fVar141 = *(float *)(bezier_basis0 + lVar19 + 0xaec);
                fVar144 = *(float *)(bezier_basis0 + lVar19 + 0xaf0);
                lVar19 = lVar13 * 4;
                fVar154 = *(float *)(bezier_basis0 + lVar19 + 0xf68);
                fVar155 = *(float *)(bezier_basis0 + lVar19 + 0xf6c);
                fVar6 = *(float *)(bezier_basis0 + lVar19 + 0xf70);
                fVar7 = *(float *)(bezier_basis0 + lVar19 + 0xf74);
                auVar116._0_4_ =
                     fVar112 * fVar103 + fVar95 * fVar111 + fVar71 * fVar137 + fVar145 * fVar154;
                auVar116._4_4_ =
                     fVar112 * fVar114 + fVar95 * fVar124 + fVar71 * fVar138 + fVar145 * fVar155;
                auVar116._8_4_ =
                     fVar112 * fVar133 + fVar95 * fVar131 + fVar71 * fVar141 + fVar145 * fVar6;
                auVar116._12_4_ =
                     fVar112 * fVar130 + fVar95 * fVar136 + fVar71 * fVar144 + fVar145 * fVar7;
                auVar126._0_4_ =
                     fVar120 * fVar103 + fVar96 * fVar111 + fVar94 * fVar137 + fVar148 * fVar154;
                auVar126._4_4_ =
                     fVar120 * fVar114 + fVar96 * fVar124 + fVar94 * fVar138 + fVar148 * fVar155;
                auVar126._8_4_ =
                     fVar120 * fVar133 + fVar96 * fVar131 + fVar94 * fVar141 + fVar148 * fVar6;
                auVar126._12_4_ =
                     fVar120 * fVar130 + fVar96 * fVar136 + fVar94 * fVar144 + fVar148 * fVar7;
                auVar73._0_4_ =
                     fVar103 * fVar123 + fVar111 * fVar100 + fVar137 * fVar86 + fVar154 * fVar153;
                auVar73._4_4_ =
                     fVar114 * fVar123 + fVar124 * fVar100 + fVar138 * fVar86 + fVar155 * fVar153;
                auVar73._8_4_ =
                     fVar133 * fVar123 + fVar131 * fVar100 + fVar141 * fVar86 + fVar6 * fVar153;
                auVar73._12_4_ =
                     fVar130 * fVar123 + fVar136 * fVar100 + fVar144 * fVar86 + fVar7 * fVar153;
                lVar19 = lVar13 * 4;
                fVar103 = *(float *)(bezier_basis0 + lVar19 + 0x13ec);
                fVar114 = *(float *)(bezier_basis0 + lVar19 + 0x13f0);
                fVar133 = *(float *)(bezier_basis0 + lVar19 + 0x13f4);
                fVar130 = *(float *)(bezier_basis0 + lVar19 + 0x13f8);
                lVar19 = lVar13 * 4;
                fVar111 = *(float *)(bezier_basis0 + lVar19 + 0x1cf4);
                fVar124 = *(float *)(bezier_basis0 + lVar19 + 0x1cf8);
                fVar131 = *(float *)(bezier_basis0 + lVar19 + 0x1cfc);
                fVar136 = *(float *)(bezier_basis0 + lVar19 + 0x1d00);
                lVar19 = lVar13 * 4;
                fVar137 = *(float *)(bezier_basis0 + lVar19 + 0x2178);
                fVar138 = *(float *)(bezier_basis0 + lVar19 + 0x217c);
                fVar141 = *(float *)(bezier_basis0 + lVar19 + 0x2180);
                fVar144 = *(float *)(bezier_basis0 + lVar19 + 0x2184);
                lVar13 = lVar13 * 4;
                fVar154 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
                fVar155 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
                fVar6 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
                fVar7 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
                fVar53 = fVar112 * fVar103 + fVar95 * fVar154 + fVar71 * fVar111 + fVar145 * fVar137
                ;
                fVar68 = fVar112 * fVar114 + fVar95 * fVar155 + fVar71 * fVar124 + fVar145 * fVar138
                ;
                fVar69 = fVar112 * fVar133 + fVar95 * fVar6 + fVar71 * fVar131 + fVar145 * fVar141;
                fVar70 = fVar112 * fVar130 + fVar95 * fVar7 + fVar71 * fVar136 + fVar145 * fVar144;
                fVar79 = fVar120 * fVar103 + fVar96 * fVar154 + fVar94 * fVar111 + fVar148 * fVar137
                ;
                fVar87 = fVar120 * fVar114 + fVar96 * fVar155 + fVar94 * fVar124 + fVar148 * fVar138
                ;
                fVar88 = fVar120 * fVar133 + fVar96 * fVar6 + fVar94 * fVar131 + fVar148 * fVar141;
                fVar89 = fVar120 * fVar130 + fVar96 * fVar7 + fVar94 * fVar136 + fVar148 * fVar144;
                fVar103 = fVar103 * fVar123 +
                          fVar154 * fVar100 + fVar111 * fVar86 + fVar137 * fVar153;
                fVar114 = fVar114 * fVar123 +
                          fVar155 * fVar100 + fVar124 * fVar86 + fVar138 * fVar153;
                fVar133 = fVar133 * fVar123 + fVar6 * fVar100 + fVar131 * fVar86 + fVar141 * fVar153
                ;
                fVar130 = fVar130 * fVar123 + fVar7 * fVar100 + fVar136 * fVar86 + fVar144 * fVar153
                ;
                uVar157 = -(uint)(iVar23 == 0);
                uVar158 = -(uint)(iVar23 == 1);
                uVar159 = -(uint)(iVar23 == 2);
                uVar160 = -(uint)(iVar23 == 3);
                uVar9 = -(uint)(iVar23 == 7);
                uVar143 = -(uint)(iVar23 == 6);
                uVar146 = -(uint)(iVar23 == 5);
                uVar147 = -(uint)(iVar23 == 4);
                auVar134._0_4_ = (float)(~uVar9 & (uint)fVar53) * 0.055555556 + auVar116._0_4_;
                auVar134._4_4_ = (float)(~uVar143 & (uint)fVar68) * 0.055555556 + auVar116._4_4_;
                auVar134._8_4_ = (float)(~uVar146 & (uint)fVar69) * 0.055555556 + auVar116._8_4_;
                auVar134._12_4_ = (float)(~uVar147 & (uint)fVar70) * 0.055555556 + auVar116._12_4_;
                auVar97 = minps(auVar118,auVar116);
                auVar150 = maxps(auVar150,auVar116);
                auVar117._0_8_ =
                     CONCAT44(auVar116._4_4_ - (float)(~uVar158 & (uint)fVar68) * 0.055555556,
                              auVar116._0_4_ - (float)(~uVar157 & (uint)fVar53) * 0.055555556);
                auVar117._8_4_ = auVar116._8_4_ - (float)(~uVar159 & (uint)fVar69) * 0.055555556;
                auVar117._12_4_ = auVar116._12_4_ - (float)(~uVar160 & (uint)fVar70) * 0.055555556;
                auVar43._0_4_ = (float)(~uVar9 & (uint)fVar79) * 0.055555556 + auVar126._0_4_;
                auVar43._4_4_ = (float)(~uVar143 & (uint)fVar87) * 0.055555556 + auVar126._4_4_;
                auVar43._8_4_ = (float)(~uVar146 & (uint)fVar88) * 0.055555556 + auVar126._8_4_;
                auVar43._12_4_ = (float)(~uVar147 & (uint)fVar89) * 0.055555556 + auVar126._12_4_;
                auVar107 = minps(auVar107,auVar126);
                auVar149 = maxps(auVar149,auVar126);
                auVar106._0_8_ =
                     CONCAT44(auVar126._4_4_ - (float)(~uVar158 & (uint)fVar87) * 0.055555556,
                              auVar126._0_4_ - (float)(~uVar157 & (uint)fVar79) * 0.055555556);
                auVar106._8_4_ = auVar126._8_4_ - (float)(~uVar159 & (uint)fVar88) * 0.055555556;
                auVar106._12_4_ = auVar126._12_4_ - (float)(~uVar160 & (uint)fVar89) * 0.055555556;
                auVar140._0_4_ = (float)(~uVar9 & (uint)fVar103) * 0.055555556 + auVar73._0_4_;
                auVar140._4_4_ = (float)(~uVar143 & (uint)fVar114) * 0.055555556 + auVar73._4_4_;
                auVar140._8_4_ = (float)(~uVar146 & (uint)fVar133) * 0.055555556 + auVar73._8_4_;
                auVar140._12_4_ = (float)(~uVar147 & (uint)fVar130) * 0.055555556 + auVar73._12_4_;
                auVar156 = minps(auVar156,auVar73);
                auVar126 = maxps(auVar56,auVar73);
                auVar74._0_8_ =
                     CONCAT44(auVar73._4_4_ - (float)(~uVar158 & (uint)fVar114) * 0.055555556,
                              auVar73._0_4_ - (float)(~uVar157 & (uint)fVar103) * 0.055555556);
                auVar74._8_4_ = auVar73._8_4_ - (float)(~uVar159 & (uint)fVar133) * 0.055555556;
                auVar74._12_4_ = auVar73._12_4_ - (float)(~uVar160 & (uint)fVar130) * 0.055555556;
                auVar54._8_4_ = auVar117._8_4_;
                auVar54._0_8_ = auVar117._0_8_;
                auVar54._12_4_ = auVar117._12_4_;
                auVar118 = minps(auVar54,auVar134);
                auVar118 = minps(auVar97,auVar118);
                auVar55._8_4_ = auVar106._8_4_;
                auVar55._0_8_ = auVar106._0_8_;
                auVar55._12_4_ = auVar106._12_4_;
                auVar56 = minps(auVar55,auVar43);
                auVar107 = minps(auVar107,auVar56);
                auVar57._8_4_ = auVar74._8_4_;
                auVar57._0_8_ = auVar74._0_8_;
                auVar57._12_4_ = auVar74._12_4_;
                auVar56 = minps(auVar57,auVar140);
                auVar156 = minps(auVar156,auVar56);
                auVar56 = maxps(auVar117,auVar134);
                auVar150 = maxps(auVar150,auVar56);
                auVar56 = maxps(auVar106,auVar43);
                auVar149 = maxps(auVar149,auVar56);
                auVar56 = maxps(auVar74,auVar140);
                auVar56 = maxps(auVar126,auVar56);
                lVar13 = 4;
                bVar8 = false;
              } while (bVar18);
              fStack_134 = fStack_134 + fVar92;
              local_268._4_4_ = (float)local_268._4_4_ + fVar101;
              fVar151 = fVar151 + fVar93;
              local_168 = local_168 + fVar132;
              local_178 = local_178 + fVar139;
              fVar152 = fVar152 + fVar142;
              fVar71 = (fVar78 + fVar104) * 0.33333334 + fStack_134;
              local_278 = (fVar91 + fVar109) * 0.33333334 + (float)local_268._4_4_;
              fVar94 = (fVar102 + fVar110) * 0.33333334 + fVar151;
              fStack_144 = local_168 - (fVar72 + fVar113) * 0.33333334;
              local_158 = local_178 - (fVar90 + fVar121) * 0.33333334;
              local_258 = fVar152 - (fVar99 + fVar122) * 0.33333334;
              auVar44._4_4_ = auVar118._0_4_;
              auVar44._0_4_ = auVar118._4_4_;
              auVar44._8_4_ = auVar118._12_4_;
              auVar44._12_4_ = auVar118._8_4_;
              auVar118 = minps(auVar44,auVar118);
              auVar58._0_8_ = auVar118._8_8_;
              auVar58._8_4_ = auVar118._0_4_;
              auVar58._12_4_ = auVar118._4_4_;
              auVar118 = minps(auVar58,auVar118);
              auVar45._4_4_ = auVar107._0_4_;
              auVar45._0_4_ = auVar107._4_4_;
              auVar45._8_4_ = auVar107._12_4_;
              auVar45._12_4_ = auVar107._8_4_;
              auVar107 = minps(auVar45,auVar107);
              auVar80._0_8_ = auVar107._8_8_;
              auVar80._8_4_ = auVar107._0_4_;
              auVar80._12_4_ = auVar107._4_4_;
              auVar107 = minps(auVar80,auVar107);
              auVar27._4_4_ = auVar156._0_4_;
              auVar27._0_4_ = auVar156._4_4_;
              auVar27._8_4_ = auVar156._12_4_;
              auVar27._12_4_ = auVar156._8_4_;
              local_1a8 = minps(auVar27,auVar156);
              local_1b8._0_8_ = local_1a8._8_8_;
              local_1b8._8_4_ = local_1a8._0_4_;
              local_1b8._12_4_ = local_1a8._4_4_;
              local_188._0_8_ = CONCAT44(auVar107._0_4_,auVar118._0_4_);
              local_188._8_4_ = auVar118._8_4_;
              local_188._12_4_ = 0;
              auVar28._4_4_ = auVar150._0_4_;
              auVar28._0_4_ = auVar150._4_4_;
              auVar28._8_4_ = auVar150._12_4_;
              auVar28._12_4_ = auVar150._8_4_;
              auVar107 = maxps(auVar28,auVar150);
              auVar46._0_8_ = auVar107._8_8_;
              auVar46._8_4_ = auVar107._0_4_;
              auVar46._12_4_ = auVar107._4_4_;
              auVar118 = maxps(auVar46,auVar107);
              auVar29._4_4_ = auVar149._0_4_;
              auVar29._0_4_ = auVar149._4_4_;
              auVar29._8_4_ = auVar149._12_4_;
              auVar29._12_4_ = auVar149._8_4_;
              auVar107 = maxps(auVar29,auVar149);
              auVar59._0_8_ = auVar107._8_8_;
              auVar59._8_4_ = auVar107._0_4_;
              auVar59._12_4_ = auVar107._4_4_;
              auVar107 = maxps(auVar59,auVar107);
              auVar30._4_4_ = auVar56._0_4_;
              auVar30._0_4_ = auVar56._4_4_;
              auVar30._8_4_ = auVar56._12_4_;
              auVar30._12_4_ = auVar56._8_4_;
              local_a8 = maxps(auVar30,auVar56);
              local_b8._0_8_ = local_a8._8_8_;
              local_b8._8_4_ = local_a8._0_4_;
              local_b8._12_4_ = local_a8._4_4_;
              local_198._0_8_ = CONCAT44(auVar107._0_4_,auVar118._0_4_);
              local_198._8_4_ = auVar118._8_4_;
              local_198._12_4_ = 0;
              local_138 = fStack_134;
              fStack_130 = fStack_134;
              fStack_12c = fStack_134;
              local_268._0_4_ = local_268._4_4_;
              fStack_260 = (float)local_268._4_4_;
              fStack_25c = (float)local_268._4_4_;
              local_148 = fStack_144;
              fStack_140 = fStack_144;
              fStack_13c = fStack_144;
              lVar13 = 0;
              local_2c8 = _DAT_01f7aa00;
              auVar107 = _DAT_01f7aa00;
              auVar118 = _DAT_01f7a9f0;
              auVar56 = _DAT_01f7a9f0;
              auVar149 = _DAT_01f7a9f0;
              auVar150 = _DAT_01f7aa00;
              bVar8 = true;
              do {
                bVar18 = bVar8;
                local_1d8 = auVar150;
                local_1e8 = auVar56;
                local_1c8 = auVar107;
                iVar23 = (int)lVar13;
                lVar19 = lVar13 * 4;
                fVar86 = *(float *)(bezier_basis0 + lVar19 + 0x1dc);
                fVar90 = *(float *)(bezier_basis0 + lVar19 + 0x1e0);
                fVar72 = *(float *)(bezier_basis0 + lVar19 + 0x1e4);
                fVar99 = *(float *)(bezier_basis0 + lVar19 + 0x1e8);
                lVar19 = lVar13 * 4;
                fVar78 = *(float *)(bezier_basis0 + lVar19 + 0x660);
                fVar91 = *(float *)(bezier_basis0 + lVar19 + 0x664);
                fVar102 = *(float *)(bezier_basis0 + lVar19 + 0x668);
                fVar95 = *(float *)(bezier_basis0 + lVar19 + 0x66c);
                lVar19 = lVar13 * 4;
                fVar96 = *(float *)(bezier_basis0 + lVar19 + 0xae4);
                fVar92 = *(float *)(bezier_basis0 + lVar19 + 0xae8);
                fVar100 = *(float *)(bezier_basis0 + lVar19 + 0xaec);
                fVar101 = *(float *)(bezier_basis0 + lVar19 + 0xaf0);
                lVar19 = lVar13 * 4;
                fVar103 = *(float *)(bezier_basis0 + lVar19 + 0xf68);
                fVar93 = *(float *)(bezier_basis0 + lVar19 + 0xf6c);
                fVar132 = *(float *)(bezier_basis0 + lVar19 + 0xf70);
                fVar139 = *(float *)(bezier_basis0 + lVar19 + 0xf74);
                auVar75._0_4_ =
                     fStack_134 * fVar86 +
                     fVar71 * fVar78 + fStack_144 * fVar96 + local_168 * fVar103;
                auVar75._4_4_ =
                     fStack_134 * fVar90 +
                     fVar71 * fVar91 + fStack_144 * fVar92 + local_168 * fVar93;
                auVar75._8_4_ =
                     fStack_134 * fVar72 +
                     fVar71 * fVar102 + fStack_144 * fVar100 + local_168 * fVar132;
                auVar75._12_4_ =
                     fStack_134 * fVar99 +
                     fVar71 * fVar95 + fStack_144 * fVar101 + local_168 * fVar139;
                auVar60._0_4_ =
                     (float)local_268._4_4_ * fVar86 +
                     local_278 * fVar78 + local_158 * fVar96 + local_178 * fVar103;
                auVar60._4_4_ =
                     (float)local_268._4_4_ * fVar90 +
                     local_278 * fVar91 + local_158 * fVar92 + local_178 * fVar93;
                auVar60._8_4_ =
                     (float)local_268._4_4_ * fVar72 +
                     local_278 * fVar102 + local_158 * fVar100 + local_178 * fVar132;
                auVar60._12_4_ =
                     (float)local_268._4_4_ * fVar99 +
                     local_278 * fVar95 + local_158 * fVar101 + local_178 * fVar139;
                auVar127._0_4_ =
                     fVar86 * fVar151 + fVar78 * fVar94 + fVar96 * local_258 + fVar103 * fVar152;
                auVar127._4_4_ =
                     fVar90 * fVar151 + fVar91 * fVar94 + fVar92 * local_258 + fVar93 * fVar152;
                auVar127._8_4_ =
                     fVar72 * fVar151 + fVar102 * fVar94 + fVar100 * local_258 + fVar132 * fVar152;
                auVar127._12_4_ =
                     fVar99 * fVar151 + fVar95 * fVar94 + fVar101 * local_258 + fVar139 * fVar152;
                lVar19 = lVar13 * 4;
                fVar86 = *(float *)(bezier_basis0 + lVar19 + 0x13ec);
                fVar90 = *(float *)(bezier_basis0 + lVar19 + 0x13f0);
                fVar72 = *(float *)(bezier_basis0 + lVar19 + 0x13f4);
                fVar99 = *(float *)(bezier_basis0 + lVar19 + 0x13f8);
                lVar19 = lVar13 * 4;
                fVar78 = *(float *)(bezier_basis0 + lVar19 + 0x1cf4);
                fVar91 = *(float *)(bezier_basis0 + lVar19 + 0x1cf8);
                fVar102 = *(float *)(bezier_basis0 + lVar19 + 0x1cfc);
                fVar95 = *(float *)(bezier_basis0 + lVar19 + 0x1d00);
                lVar19 = lVar13 * 4;
                fVar96 = *(float *)(bezier_basis0 + lVar19 + 0x2178);
                fVar92 = *(float *)(bezier_basis0 + lVar19 + 0x217c);
                fVar100 = *(float *)(bezier_basis0 + lVar19 + 0x2180);
                fVar101 = *(float *)(bezier_basis0 + lVar19 + 0x2184);
                lVar13 = lVar13 * 4;
                fVar103 = *(float *)(bezier_basis0 + lVar13 + 0x1870);
                fVar93 = *(float *)(bezier_basis0 + lVar13 + 0x1874);
                fVar132 = *(float *)(bezier_basis0 + lVar13 + 0x1878);
                fVar139 = *(float *)(bezier_basis0 + lVar13 + 0x187c);
                fVar142 = fStack_134 * fVar86 +
                          fVar71 * fVar103 + fStack_144 * fVar78 + local_168 * fVar96;
                fVar114 = fStack_134 * fVar90 +
                          fVar71 * fVar93 + fStack_144 * fVar91 + local_168 * fVar92;
                fVar112 = fStack_134 * fVar72 +
                          fVar71 * fVar132 + fStack_144 * fVar102 + local_168 * fVar100;
                fVar120 = fStack_134 * fVar99 +
                          fVar71 * fVar139 + fStack_144 * fVar95 + local_168 * fVar101;
                fVar123 = (float)local_268._4_4_ * fVar86 +
                          local_278 * fVar103 + local_158 * fVar78 + local_178 * fVar96;
                fVar133 = (float)local_268._4_4_ * fVar90 +
                          local_278 * fVar93 + local_158 * fVar91 + local_178 * fVar92;
                fVar145 = (float)local_268._4_4_ * fVar72 +
                          local_278 * fVar132 + local_158 * fVar102 + local_178 * fVar100;
                fVar148 = (float)local_268._4_4_ * fVar99 +
                          local_278 * fVar139 + local_158 * fVar95 + local_178 * fVar101;
                fVar86 = fVar86 * fVar151 + fVar103 * fVar94 + fVar78 * local_258 + fVar96 * fVar152
                ;
                fVar90 = fVar90 * fVar151 + fVar93 * fVar94 + fVar91 * local_258 + fVar92 * fVar152;
                fVar72 = fVar72 * fVar151 +
                         fVar132 * fVar94 + fVar102 * local_258 + fVar100 * fVar152;
                fVar99 = fVar99 * fVar151 +
                         fVar139 * fVar94 + fVar95 * local_258 + fVar101 * fVar152;
                uVar157 = -(uint)(iVar23 == 0);
                uVar158 = -(uint)(iVar23 == 1);
                uVar159 = -(uint)(iVar23 == 2);
                uVar160 = -(uint)(iVar23 == 3);
                uVar9 = -(uint)(iVar23 == 7);
                uVar143 = -(uint)(iVar23 == 6);
                uVar146 = -(uint)(iVar23 == 5);
                uVar147 = -(uint)(iVar23 == 4);
                auVar31._0_4_ = (float)(~uVar9 & (uint)fVar142) * 0.055555556 + auVar75._0_4_;
                auVar31._4_4_ = (float)(~uVar143 & (uint)fVar114) * 0.055555556 + auVar75._4_4_;
                auVar31._8_4_ = (float)(~uVar146 & (uint)fVar112) * 0.055555556 + auVar75._8_4_;
                auVar31._12_4_ = (float)(~uVar147 & (uint)fVar120) * 0.055555556 + auVar75._12_4_;
                auVar149 = minps(auVar149,auVar75);
                auVar150 = maxps(local_1d8,auVar75);
                auVar135._0_8_ =
                     CONCAT44(auVar75._4_4_ - (float)(~uVar158 & (uint)fVar114) * 0.055555556,
                              auVar75._0_4_ - (float)(~uVar157 & (uint)fVar142) * 0.055555556);
                auVar135._8_4_ = auVar75._8_4_ - (float)(~uVar159 & (uint)fVar112) * 0.055555556;
                auVar135._12_4_ = auVar75._12_4_ - (float)(~uVar160 & (uint)fVar120) * 0.055555556;
                auVar76._0_4_ = (float)(~uVar9 & (uint)fVar123) * 0.055555556 + auVar60._0_4_;
                auVar76._4_4_ = (float)(~uVar143 & (uint)fVar133) * 0.055555556 + auVar60._4_4_;
                auVar76._8_4_ = (float)(~uVar146 & (uint)fVar145) * 0.055555556 + auVar60._8_4_;
                auVar76._12_4_ = (float)(~uVar147 & (uint)fVar148) * 0.055555556 + auVar60._12_4_;
                auVar118 = minps(auVar118,auVar60);
                auVar97 = maxps(local_2c8,auVar60);
                auVar61._0_8_ =
                     CONCAT44(auVar60._4_4_ - (float)(~uVar158 & (uint)fVar133) * 0.055555556,
                              auVar60._0_4_ - (float)(~uVar157 & (uint)fVar123) * 0.055555556);
                auVar61._8_4_ = auVar60._8_4_ - (float)(~uVar159 & (uint)fVar145) * 0.055555556;
                auVar61._12_4_ = auVar60._12_4_ - (float)(~uVar160 & (uint)fVar148) * 0.055555556;
                auVar47._0_4_ = (float)(~uVar9 & (uint)fVar86) * 0.055555556 + auVar127._0_4_;
                auVar47._4_4_ = (float)(~uVar143 & (uint)fVar90) * 0.055555556 + auVar127._4_4_;
                auVar47._8_4_ = (float)(~uVar146 & (uint)fVar72) * 0.055555556 + auVar127._8_4_;
                auVar47._12_4_ = (float)(~uVar147 & (uint)fVar99) * 0.055555556 + auVar127._12_4_;
                auVar56 = minps(local_1e8,auVar127);
                auVar156 = maxps(local_1c8,auVar127);
                auVar128._0_8_ =
                     CONCAT44(auVar127._4_4_ - (float)(~uVar158 & (uint)fVar90) * 0.055555556,
                              auVar127._0_4_ - (float)(~uVar157 & (uint)fVar86) * 0.055555556);
                auVar128._8_4_ = auVar127._8_4_ - (float)(~uVar159 & (uint)fVar72) * 0.055555556;
                auVar128._12_4_ = auVar127._12_4_ - (float)(~uVar160 & (uint)fVar99) * 0.055555556;
                auVar81._8_4_ = auVar135._8_4_;
                auVar81._0_8_ = auVar135._0_8_;
                auVar81._12_4_ = auVar135._12_4_;
                auVar107 = minps(auVar81,auVar31);
                auVar149 = minps(auVar149,auVar107);
                auVar82._8_4_ = auVar61._8_4_;
                auVar82._0_8_ = auVar61._0_8_;
                auVar82._12_4_ = auVar61._12_4_;
                auVar107 = minps(auVar82,auVar76);
                auVar118 = minps(auVar118,auVar107);
                auVar83._8_4_ = auVar128._8_4_;
                auVar83._0_8_ = auVar128._0_8_;
                auVar83._12_4_ = auVar128._12_4_;
                auVar107 = minps(auVar83,auVar47);
                auVar56 = minps(auVar56,auVar107);
                auVar107 = maxps(auVar135,auVar31);
                auVar150 = maxps(auVar150,auVar107);
                auVar107 = maxps(auVar61,auVar76);
                local_2c8 = maxps(auVar97,auVar107);
                auVar107 = maxps(auVar128,auVar47);
                auVar107 = maxps(auVar156,auVar107);
                lVar13 = 4;
                bVar8 = false;
              } while (bVar18);
              auVar156 = minps(local_1b8,local_1a8);
              auVar77._8_4_ = auVar156._0_4_;
              auVar77._0_8_ = local_188._0_8_;
              auVar77._12_4_ = 0;
              auVar156 = maxps(local_b8,local_a8);
              auVar84._8_4_ = auVar156._0_4_;
              auVar84._0_8_ = local_198._0_8_;
              auVar84._12_4_ = 0;
              auVar32._4_4_ = auVar149._0_4_;
              auVar32._0_4_ = auVar149._4_4_;
              auVar32._8_4_ = auVar149._12_4_;
              auVar32._12_4_ = auVar149._8_4_;
              auVar149 = minps(auVar32,auVar149);
              auVar48._0_8_ = auVar149._8_8_;
              auVar48._8_4_ = auVar149._0_4_;
              auVar48._12_4_ = auVar149._4_4_;
              auVar149 = minps(auVar48,auVar149);
              auVar33._4_4_ = auVar118._0_4_;
              auVar33._0_4_ = auVar118._4_4_;
              auVar33._8_4_ = auVar118._12_4_;
              auVar33._12_4_ = auVar118._8_4_;
              auVar118 = minps(auVar33,auVar118);
              auVar62._0_8_ = auVar118._8_8_;
              auVar62._8_4_ = auVar118._0_4_;
              auVar62._12_4_ = auVar118._4_4_;
              auVar156 = minps(auVar62,auVar118);
              auVar34._4_4_ = auVar56._0_4_;
              auVar34._0_4_ = auVar56._4_4_;
              auVar34._8_4_ = auVar56._12_4_;
              auVar34._12_4_ = auVar56._8_4_;
              auVar118 = minps(auVar34,auVar56);
              auVar49._0_8_ = auVar118._8_8_;
              auVar49._8_4_ = auVar118._0_4_;
              auVar49._12_4_ = auVar118._4_4_;
              auVar118 = minps(auVar49,auVar118);
              auVar63._4_4_ = auVar156._0_4_;
              auVar63._0_4_ = auVar149._0_4_;
              auVar63._8_4_ = auVar118._0_4_;
              auVar63._12_4_ = 0;
              auVar149 = minps(auVar77,auVar63);
              auVar35._4_4_ = auVar150._0_4_;
              auVar35._0_4_ = auVar150._4_4_;
              auVar35._8_4_ = auVar150._12_4_;
              auVar35._12_4_ = auVar150._8_4_;
              auVar118 = maxps(auVar35,auVar150);
              auVar50._0_8_ = auVar118._8_8_;
              auVar50._8_4_ = auVar118._0_4_;
              auVar50._12_4_ = auVar118._4_4_;
              auVar56 = maxps(auVar50,auVar118);
              auVar36._4_4_ = local_2c8._0_4_;
              auVar36._0_4_ = local_2c8._4_4_;
              auVar36._8_4_ = local_2c8._12_4_;
              auVar36._12_4_ = local_2c8._8_4_;
              auVar118 = maxps(auVar36,local_2c8);
              auVar64._0_8_ = auVar118._8_8_;
              auVar64._8_4_ = auVar118._0_4_;
              auVar64._12_4_ = auVar118._4_4_;
              auVar118 = maxps(auVar64,auVar118);
              auVar37._4_4_ = auVar107._0_4_;
              auVar37._0_4_ = auVar107._4_4_;
              auVar37._8_4_ = auVar107._12_4_;
              auVar37._12_4_ = auVar107._8_4_;
              auVar107 = maxps(auVar37,auVar107);
              auVar51._0_8_ = auVar107._8_8_;
              auVar51._8_4_ = auVar107._0_4_;
              auVar51._12_4_ = auVar107._4_4_;
              auVar107 = maxps(auVar51,auVar107);
              auVar65._4_4_ = auVar118._0_4_;
              auVar65._0_4_ = auVar56._0_4_;
              auVar65._8_4_ = auVar107._0_4_;
              auVar65._12_4_ = 0;
              auVar107 = maxps(auVar84,auVar65);
              auVar85._0_4_ = -(uint)(auVar107._0_4_ < fVar40 && -1.844e+18 < auVar149._0_4_);
              auVar85._4_4_ = -(uint)(auVar107._4_4_ < fVar24 && -1.844e+18 < auVar149._4_4_);
              auVar85._8_4_ = -(uint)(auVar107._8_4_ < fVar25 && -1.844e+18 < auVar149._8_4_);
              auVar85._12_4_ = -(uint)(auVar107._12_4_ < fVar41 && -1.844e+18 < auVar149._12_4_);
              uVar10 = movmskps((int)lVar16,auVar85);
              fStack_274 = local_278;
              fStack_270 = local_278;
              fStack_26c = local_278;
              fStack_254 = local_258;
              fStack_250 = local_258;
              fStack_24c = local_258;
              fStack_174 = local_178;
              fStack_170 = local_178;
              fStack_16c = local_178;
              fStack_164 = local_168;
              fStack_160 = local_168;
              fStack_15c = local_168;
              fStack_154 = local_158;
              fStack_150 = local_158;
              fStack_14c = local_158;
              if ((~(byte)uVar10 & 7) != 0) goto LAB_009db6a7;
              uVar15 = uVar15 + 1;
            } while (uVar15 <= local_110);
            local_2e8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                        super_CurveGeometry.super_Geometry.time_range;
          }
          local_288.primID = &local_100;
          local_278 = (fVar3 - local_2e8.lower) / (local_2e8.upper - local_2e8.lower);
          fVar71 = (fVar2 - local_2e8.lower) / (local_2e8.upper - local_2e8.lower);
          fVar24 = fVar125 * local_278;
          fVar41 = fVar125 * fVar71;
          local_288.this = this;
          local_100 = uVar14;
          fVar40 = floorf(fVar24);
          fVar25 = ceilf(fVar41);
          uVar22 = (uint)fVar40;
          if (fVar40 <= 0.0) {
            fVar40 = 0.0;
          }
          fVar94 = fVar25;
          if (fVar125 <= fVar25) {
            fVar94 = fVar125;
          }
          if ((int)uVar22 < 0) {
            uVar22 = 0xffffffff;
          }
          iVar23 = (int)fVar125 + 1;
          if ((int)fVar25 < (int)fVar125 + 1) {
            iVar23 = (int)fVar25;
          }
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_d8.field_1,&local_288,(long)(int)fVar40);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_f8.field_1,&local_288,(long)(int)fVar94);
          if (iVar23 - uVar22 == 1) {
            fVar125 = fVar24 - fVar40;
            if (fVar24 - fVar40 <= 0.0) {
              fVar125 = 0.0;
            }
            fVar40 = 1.0 - fVar125;
            auVar115._0_4_ = fVar40 * local_d8.m128[0] + fVar125 * local_f8.m128[0];
            auVar115._4_4_ = fVar40 * local_d8.m128[1] + fVar125 * local_f8.m128[1];
            auVar115._8_4_ = fVar40 * local_d8.m128[2] + fVar125 * local_f8.m128[2];
            auVar115._12_4_ = fVar40 * local_d8.m128[3] + fVar125 * local_f8.m128[3];
            auVar105._0_4_ = fVar40 * local_c8 + fVar125 * local_e8;
            auVar105._4_4_ = fVar40 * fStack_c4 + fVar125 * fStack_e4;
            auVar105._8_4_ = fVar40 * fStack_c0 + fVar125 * fStack_e0;
            auVar105._12_4_ = fVar40 * fStack_bc + fVar125 * fStack_dc;
            fVar125 = fVar94 - fVar41;
            if (fVar94 - fVar41 <= 0.0) {
              fVar125 = 0.0;
            }
            fVar40 = 1.0 - fVar125;
            auVar26._0_4_ = local_f8.m128[0] * fVar40 + local_d8.m128[0] * fVar125;
            auVar26._4_4_ = local_f8.m128[1] * fVar40 + local_d8.m128[1] * fVar125;
            auVar26._8_4_ = local_f8.m128[2] * fVar40 + local_d8.m128[2] * fVar125;
            auVar26._12_4_ = local_f8.m128[3] * fVar40 + local_d8.m128[3] * fVar125;
            auVar42._0_4_ = fVar40 * local_e8 + fVar125 * local_c8;
            auVar42._4_4_ = fVar40 * fStack_e4 + fVar125 * fStack_c4;
            auVar42._8_4_ = fVar40 * fStack_e0 + fVar125 * fStack_c0;
            auVar42._12_4_ = fVar40 * fStack_dc + fVar125 * fStack_bc;
            uVar9 = 1;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_288,(long)((int)fVar40 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_288,(long)((int)fVar94 + -1));
            fVar25 = fVar24 - fVar40;
            if (fVar24 - fVar40 <= 0.0) {
              fVar25 = 0.0;
            }
            fVar40 = 1.0 - fVar25;
            auVar115._0_4_ = local_d8.m128[0] * fVar40 + local_58.m128[0] * fVar25;
            auVar115._4_4_ = local_d8.m128[1] * fVar40 + local_58.m128[1] * fVar25;
            auVar115._8_4_ = local_d8.m128[2] * fVar40 + local_58.m128[2] * fVar25;
            auVar115._12_4_ = local_d8.m128[3] * fVar40 + local_58.m128[3] * fVar25;
            auVar105._0_4_ = fVar40 * local_c8 + fVar25 * local_48;
            auVar105._4_4_ = fVar40 * fStack_c4 + fVar25 * fStack_44;
            auVar105._8_4_ = fVar40 * fStack_c0 + fVar25 * fStack_40;
            auVar105._12_4_ = fVar40 * fStack_bc + fVar25 * fStack_3c;
            fVar40 = fVar94 - fVar41;
            if (fVar94 - fVar41 <= 0.0) {
              fVar40 = 0.0;
            }
            fVar24 = 1.0 - fVar40;
            auVar129._0_8_ =
                 CONCAT44(local_f8.m128[1] * fVar24 + local_78.m128[1] * fVar40,
                          local_f8.m128[0] * fVar24 + local_78.m128[0] * fVar40);
            auVar129._8_4_ = local_f8.m128[2] * fVar24 + local_78.m128[2] * fVar40;
            auVar129._12_4_ = local_f8.m128[3] * fVar24 + local_78.m128[3] * fVar40;
            auVar98._0_8_ =
                 CONCAT44(fVar24 * fStack_e4 + fVar40 * fStack_64,
                          fVar24 * local_e8 + fVar40 * local_68);
            auVar98._8_4_ = fVar24 * fStack_e0 + fVar40 * fStack_60;
            auVar98._12_4_ = fVar24 * fStack_dc + fVar40 * fStack_5c;
            uVar9 = uVar22 + 1;
            if ((int)uVar9 < iVar23) {
              fVar71 = fVar71 - local_278;
              sVar21 = (size_t)uVar9;
              iVar23 = ~uVar22 + iVar23;
              do {
                fVar40 = ((float)(int)sVar21 / fVar125 - local_278) / fVar71;
                fVar24 = 1.0 - fVar40;
                fVar86 = auVar115._4_4_;
                fVar90 = auVar115._8_4_;
                fVar72 = auVar115._12_4_;
                fVar25 = auVar105._4_4_;
                fVar41 = auVar105._8_4_;
                fVar94 = auVar105._12_4_;
                local_258 = fVar24 * auVar105._0_4_ + fVar40 * auVar98._0_4_;
                fStack_254 = fVar24 * fVar25 + fVar40 * auVar98._4_4_;
                fStack_250 = fVar24 * fVar41 + fVar40 * auVar98._8_4_;
                fStack_24c = fVar24 * fVar94 + fVar40 * auVar98._12_4_;
                _local_268 = auVar129;
                pBVar11 = linearBounds::anon_class_16_2_07cfa4d6::operator()
                                    ((BBox3fa *)&local_98.field_1,&local_288,sVar21);
                uVar9 = (uint)pBVar11;
                auVar38._0_4_ =
                     local_98.m128[0] - (auVar115._0_4_ * fVar24 + auVar129._0_4_ * fVar40);
                auVar38._4_4_ = local_98.m128[1] - (fVar86 * fVar24 + auVar129._4_4_ * fVar40);
                auVar38._8_4_ = local_98.m128[2] - (fVar90 * fVar24 + auVar129._8_4_ * fVar40);
                auVar38._12_4_ = local_98.m128[3] - (fVar72 * fVar24 + auVar129._12_4_ * fVar40);
                auVar52._0_4_ = local_88 - local_258;
                auVar52._4_4_ = fStack_84 - fStack_254;
                auVar52._8_4_ = fStack_80 - fStack_250;
                auVar52._12_4_ = fStack_7c - fStack_24c;
                auVar107 = minps(auVar38,ZEXT816(0));
                auVar118 = maxps(auVar52,ZEXT816(0));
                auVar115._0_4_ = auVar115._0_4_ + auVar107._0_4_;
                auVar115._4_4_ = fVar86 + auVar107._4_4_;
                auVar115._8_4_ = fVar90 + auVar107._8_4_;
                auVar115._12_4_ = fVar72 + auVar107._12_4_;
                auVar26._0_8_ =
                     CONCAT44(auVar107._4_4_ + (float)local_268._4_4_,
                              auVar107._0_4_ + (float)local_268._0_4_);
                auVar26._8_4_ = auVar107._8_4_ + fStack_260;
                auVar26._12_4_ = auVar107._12_4_ + fStack_25c;
                auVar105._0_4_ = auVar105._0_4_ + auVar118._0_4_;
                auVar105._4_4_ = fVar25 + auVar118._4_4_;
                auVar105._8_4_ = fVar41 + auVar118._8_4_;
                auVar105._12_4_ = fVar94 + auVar118._12_4_;
                auVar42._0_8_ =
                     CONCAT44(auVar118._4_4_ + auVar98._4_4_,auVar118._0_4_ + auVar98._0_4_);
                auVar42._8_4_ = auVar118._8_4_ + auVar98._8_4_;
                auVar42._12_4_ = auVar118._12_4_ + auVar98._12_4_;
                sVar21 = sVar21 + 1;
                auVar98._8_4_ = auVar42._8_4_;
                auVar98._0_8_ = auVar42._0_8_;
                auVar98._12_4_ = auVar42._12_4_;
                auVar129._8_4_ = auVar26._8_4_;
                auVar129._0_8_ = auVar26._0_8_;
                auVar129._12_4_ = auVar26._12_4_;
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            else {
              auVar26._8_4_ = auVar129._8_4_;
              auVar26._0_8_ = auVar129._0_8_;
              auVar26._12_4_ = auVar129._12_4_;
              auVar42._8_4_ = auVar98._8_4_;
              auVar42._0_8_ = auVar98._0_8_;
              auVar42._12_4_ = auVar98._12_4_;
            }
          }
          auVar66._4_4_ = -(uint)(auVar115._4_4_ <= auVar105._4_4_);
          auVar66._0_4_ = -(uint)(auVar115._0_4_ <= auVar105._0_4_);
          auVar66._8_4_ = -(uint)(auVar115._8_4_ <= auVar105._8_4_);
          auVar66._12_4_ = -(uint)(auVar115._12_4_ <= auVar105._12_4_);
          uVar10 = movmskps(uVar9,auVar66);
          if (((~(byte)uVar10 & 7) == 0) &&
             (auVar67._4_4_ = -(uint)(auVar26._4_4_ <= auVar42._4_4_),
             auVar67._0_4_ = -(uint)(auVar26._0_4_ <= auVar42._0_4_),
             auVar67._8_4_ = -(uint)(auVar26._8_4_ <= auVar42._8_4_),
             auVar67._12_4_ = -(uint)(auVar26._12_4_ <= auVar42._12_4_),
             uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar67),
             (~(byte)uVar10 & 7) == 0)) {
            auVar118 = minps(auVar115,auVar26);
            auVar107 = maxps(auVar105,auVar42);
            aVar119._0_12_ = auVar118._0_12_;
            aVar119.m128[3] = (float)geomID;
            aVar108._0_12_ = auVar107._0_12_;
            aVar108.m128[3] = (float)uVar14;
            auVar39._0_4_ = auVar118._0_4_ + auVar107._0_4_;
            auVar39._4_4_ = auVar118._4_4_ + auVar107._4_4_;
            auVar39._8_4_ = auVar118._8_4_ + auVar107._8_4_;
            auVar39._12_4_ = (float)geomID + (float)uVar14;
            local_228 = minps(local_228,(undefined1  [16])aVar119);
            local_218 = maxps(local_218,(undefined1  [16])aVar108);
            local_1f8 = minps(local_1f8,auVar39);
            local_208 = maxps(local_208,auVar39);
            local_240 = local_240 + 1;
            local_120[local_230].lower.field_0 = aVar119;
            local_120[local_230].upper.field_0 = aVar108;
            local_230 = local_230 + 1;
          }
        }
LAB_009db6a7:
        uVar14 = uVar14 + 1;
      } while (uVar14 < r->_end);
    }
    else {
      local_240 = 0;
      local_218._8_8_ = 0xff800000ff800000;
      local_218._0_8_ = 0xff800000ff800000;
      local_228._8_8_ = 0x7f8000007f800000;
      local_228._0_8_ = 0x7f8000007f800000;
    }
    *(undefined8 *)
     &(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_228._0_8_;
    *(undefined8 *)
     ((long)&(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8
     ) = local_228._8_8_;
    *(undefined8 *)
     &(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_218._0_8_;
    *(undefined8 *)
     ((long)&(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8
     ) = local_218._8_8_;
    *(undefined8 *)
     &(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
         local_1f8._0_8_;
    *(undefined8 *)
     ((long)&(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 + 8
     ) = local_1f8._8_8_;
    *(undefined8 *)
     &(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
         local_208._0_8_;
    *(undefined8 *)
     ((long)&(local_118->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 + 8
     ) = local_208._8_8_;
    local_118->end = local_240;
    __return_storage_ptr__ = local_118;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }